

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

void __thiscall Highs::appendNonbasicColsToBasisInterface(Highs *this,HighsInt ext_num_new_col)

{
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this_00;
  double dVar1;
  double val;
  bool bVar2;
  int iVar3;
  pointer piVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  HighsBasisStatus HVar11;
  int iVar12;
  size_type __new_size;
  int iVar13;
  size_type __new_size_00;
  
  if ((ext_num_new_col != 0) && ((this->basis_).useful == true)) {
    bVar2 = (this->ekk_instance_).status_.has_basis;
    iVar13 = (this->model_).lp_.num_col_ + ext_num_new_col;
    iVar3 = (this->model_).lp_.num_row_;
    this_00 = &(this->basis_).col_status;
    __new_size_00 = (size_type)iVar13;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(this_00,__new_size_00);
    if (bVar2 == true) {
      __new_size = (long)iVar3 + __new_size_00;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (&(this->ekk_instance_).basis_.nonbasicFlag_,__new_size);
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (&(this->ekk_instance_).basis_.nonbasicMove_,__new_size);
      lVar9 = (long)(this->model_).lp_.num_row_;
      if (0 < lVar9) {
        uVar10 = lVar9 + 1;
        do {
          piVar4 = (this->ekk_instance_).basis_.basicIndex_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar3 = piVar4[uVar10 - 2];
          iVar12 = (this->model_).lp_.num_col_;
          if (iVar12 <= iVar3) {
            piVar4[uVar10 - 2] = iVar3 + ext_num_new_col;
            iVar12 = (this->model_).lp_.num_col_;
          }
          pcVar5 = (this->ekk_instance_).basis_.nonbasicFlag_.
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar5[(uVar10 - 2) + __new_size_00] = pcVar5[(uVar10 - 2) + (long)iVar12];
          pcVar5 = (this->ekk_instance_).basis_.nonbasicMove_.
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar5[(uVar10 - 2) + __new_size_00] =
               pcVar5[(uVar10 - 2) + (long)(this->model_).lp_.num_col_];
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
    }
    iVar3 = (this->model_).lp_.num_col_;
    lVar9 = (long)iVar3;
    if (iVar3 < iVar13) {
      iVar13 = iVar13 - iVar3;
      do {
        dVar1 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar9];
        val = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar9];
        if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
          bVar6 = highs_isInfinity(-dVar1);
          bVar7 = highs_isInfinity(val);
          if (bVar6) {
            HVar11 = bVar7 + kUpper;
            bVar8 = bVar7 - 1;
          }
          else if (bVar7) {
            bVar8 = 1;
            HVar11 = kLower;
          }
          else {
            HVar11 = (ABS(val) <= ABS(dVar1)) * '\x02';
            bVar8 = -(ABS(val) <= ABS(dVar1)) | 1;
          }
        }
        else {
          HVar11 = kLower;
          bVar8 = 0;
        }
        (this_00->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar9] = HVar11;
        if (bVar2 != false) {
          (this->ekk_instance_).basis_.nonbasicFlag_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] = '\x01';
          (this->ekk_instance_).basis_.nonbasicMove_.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] = bVar8;
        }
        lVar9 = lVar9 + 1;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
  }
  return;
}

Assistant:

void Highs::appendNonbasicColsToBasisInterface(const HighsInt ext_num_new_col) {
  if (ext_num_new_col == 0) return;
  HighsBasis& highs_basis = basis_;
  if (!highs_basis.useful) return;
  const bool has_simplex_basis = ekk_instance_.status_.has_basis;
  SimplexBasis& simplex_basis = ekk_instance_.basis_;
  HighsLp& lp = model_.lp_;

  assert(highs_basis.col_status.size() == static_cast<size_t>(lp.num_col_));
  assert(highs_basis.row_status.size() == static_cast<size_t>(lp.num_row_));

  // Add nonbasic structurals
  HighsInt newNumCol = lp.num_col_ + ext_num_new_col;
  HighsInt newNumTot = newNumCol + lp.num_row_;
  highs_basis.col_status.resize(newNumCol);
  if (has_simplex_basis) {
    simplex_basis.nonbasicFlag_.resize(newNumTot);
    simplex_basis.nonbasicMove_.resize(newNumTot);
    // Shift the row data in basicIndex, nonbasicFlag and nonbasicMove if
    // necessary
    for (HighsInt iRow = lp.num_row_ - 1; iRow >= 0; iRow--) {
      HighsInt iCol = simplex_basis.basicIndex_[iRow];
      if (iCol >= lp.num_col_) {
        // This basic variable is a row, so shift its index
        simplex_basis.basicIndex_[iRow] += ext_num_new_col;
      }
      simplex_basis.nonbasicFlag_[newNumCol + iRow] =
          simplex_basis.nonbasicFlag_[lp.num_col_ + iRow];
      simplex_basis.nonbasicMove_[newNumCol + iRow] =
          simplex_basis.nonbasicMove_[lp.num_col_ + iRow];
    }
  }
  // Make any new columns nonbasic
  for (HighsInt iCol = lp.num_col_; iCol < newNumCol; iCol++) {
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      status = HighsBasisStatus::kLower;
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (fabs(lower) < fabs(upper)) {
          status = HighsBasisStatus::kLower;
          move = kNonbasicMoveUp;
        } else {
          status = HighsBasisStatus::kUpper;
          move = kNonbasicMoveDn;
        }
      } else {
        // Lower (since upper bound is infinite)
        status = HighsBasisStatus::kLower;
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      status = HighsBasisStatus::kUpper;
      move = kNonbasicMoveDn;
    } else {
      // FREE
      status = HighsBasisStatus::kZero;
      move = kNonbasicMoveZe;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    highs_basis.col_status[iCol] = status;
    if (has_simplex_basis) {
      assert(move != kIllegalMoveValue);
      simplex_basis.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
      simplex_basis.nonbasicMove_[iCol] = move;
    }
  }
}